

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O3

void testJacobiEigenSolverImp<double>(void)

{
  Matrix44<double> local_a8;
  
  local_a8.x[0][0] = 1.0;
  local_a8.x[0][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  local_a8.x[1][0] = 1.0;
  local_a8.x[1][1] = 0.0;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[2][0] = 1.0;
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&local_a8);
  local_a8.x[0][0] = 1.0;
  local_a8.x[0][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  local_a8.x[1][0] = -1.0;
  local_a8.x[1][1] = 0.0;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[2][0] = 1.0;
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&local_a8);
  local_a8.x[0][0] = 1.0;
  local_a8.x[0][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  local_a8.x[1][0] = 1.0;
  local_a8.x[1][1] = 0.0;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[2][0] = 0.0;
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&local_a8);
  local_a8.x[0][0] = 1.0;
  local_a8.x[0][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  local_a8.x[1][0] = 0.0;
  local_a8.x[1][1] = 0.0;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[2][0] = 0.0;
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&local_a8);
  local_a8.x[2][0] = 0.0;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[1][0] = 0.0;
  local_a8.x[1][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  local_a8.x[0][0] = 0.0;
  local_a8.x[0][1] = 0.0;
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&local_a8);
  local_a8.x[0][0] = 1.0;
  local_a8.x[0][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  local_a8.x[1][0] = 1e-10;
  local_a8.x[1][1] = 0.0;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[2][0] = 0.0;
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&local_a8);
  local_a8.x[0][0] = 1.0;
  local_a8.x[0][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  local_a8.x[1][0] = 1e-10;
  local_a8.x[1][1] = 0.0;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[2][0] = 10000000000.0;
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&local_a8);
  local_a8.x[0][0] = 0.25058694044821;
  local_a8.x[0][1] = 0.49427229444416;
  local_a8.x[0][2] = 0.81415724537748;
  local_a8.x[0][3] = 0.49427229444416;
  local_a8.x[1][0] = 0.80192384710853;
  local_a8.x[1][1] = -0.6167494822491;
  local_a8.x[1][2] = 0.81415724537748;
  local_a8.x[1][3] = -0.6167494822491;
  local_a8.x[2][0] = -1.28486154645285;
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&local_a8);
  local_a8.x[0][0] = 1.0;
  local_a8.x[0][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  local_a8.x[1][0] = 0.0;
  local_a8.x[1][1] = 1.0;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[2][0] = 0.0;
  local_a8.x[2][1] = 0.0;
  local_a8.x[2][2] = 1.0;
  local_a8.x[2][3] = 0.0;
  local_a8.x[3][0] = 0.0;
  local_a8.x[3][1] = 0.0;
  local_a8.x[3][2] = 0.0;
  local_a8.x[3][3] = 1.0;
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&local_a8);
  local_a8.x[0][0] = 1.0;
  local_a8.x[0][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  local_a8.x[1][0] = 0.0;
  local_a8.x[1][1] = -1.0;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[2][0] = 0.0;
  local_a8.x[2][1] = 0.0;
  local_a8.x[2][2] = 1.0;
  local_a8.x[2][3] = 0.0;
  local_a8.x[3][0] = 0.0;
  local_a8.x[3][1] = 0.0;
  local_a8.x[3][2] = 0.0;
  local_a8.x[3][3] = 1.0;
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&local_a8);
  local_a8.x[0][0] = 1.0;
  local_a8.x[0][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  local_a8.x[1][0] = 0.0;
  local_a8.x[1][1] = 1.0;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[2][0] = 0.0;
  local_a8.x[2][1] = 0.0;
  local_a8.x[2][2] = 0.0;
  local_a8.x[2][3] = 0.0;
  local_a8.x[3][0] = 0.0;
  local_a8.x[3][1] = 0.0;
  local_a8.x[3][2] = 0.0;
  local_a8.x[3][3] = 0.0;
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&local_a8);
  local_a8.x[0][0] = 1.0;
  local_a8.x[0][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  local_a8.x[1][0] = 0.0;
  local_a8.x[1][1] = 0.0;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[2][0] = 0.0;
  local_a8.x[2][1] = 0.0;
  local_a8.x[2][2] = 0.0;
  local_a8.x[2][3] = 0.0;
  local_a8.x[3][0] = 0.0;
  local_a8.x[3][1] = 0.0;
  local_a8.x[3][2] = 0.0;
  local_a8.x[3][3] = 0.0;
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&local_a8);
  local_a8.x[3][2] = 0.0;
  local_a8.x[3][3] = 0.0;
  local_a8.x[3][0] = 0.0;
  local_a8.x[3][1] = 0.0;
  local_a8.x[2][2] = 0.0;
  local_a8.x[2][3] = 0.0;
  local_a8.x[2][0] = 0.0;
  local_a8.x[2][1] = 0.0;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[1][0] = 0.0;
  local_a8.x[1][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  local_a8.x[0][0] = 0.0;
  local_a8.x[0][1] = 0.0;
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&local_a8);
  local_a8.x[0][0] = 1.0;
  local_a8.x[0][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  local_a8.x[1][0] = 0.0;
  local_a8.x[1][1] = 1e-20;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[2][0] = 0.0;
  local_a8.x[2][1] = 0.0;
  local_a8.x[2][2] = 0.0;
  local_a8.x[2][3] = 0.0;
  local_a8.x[3][0] = 0.0;
  local_a8.x[3][1] = 0.0;
  local_a8.x[3][2] = 0.0;
  local_a8.x[3][3] = 0.0;
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&local_a8);
  local_a8.x[0][0] = 1.0;
  local_a8.x[0][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  local_a8.x[1][0] = 0.0;
  local_a8.x[1][1] = 1e-20;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[2][0] = 0.0;
  local_a8.x[2][1] = 0.0;
  local_a8.x[2][2] = 0.0;
  local_a8.x[2][3] = 0.0;
  local_a8.x[3][0] = 0.0;
  local_a8.x[3][1] = 0.0;
  local_a8.x[3][2] = 0.0;
  local_a8.x[3][3] = 1e+20;
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&local_a8);
  local_a8.x[0][0] = 4.05747631538951;
  local_a8.x[0][1] = 0.163581230756;
  local_a8.x[0][2] = 0.11541756047409;
  local_a8.x[0][3] = -1.6536922346527;
  local_a8.x[1][0] = 0.163581230756;
  local_a8.x[1][1] = 0.5762982939078;
  local_a8.x[1][2] = 3.88542912704029;
  local_a8.x[1][3] = 0.92016316185369;
  local_a8.x[2][0] = 0.11541756047409;
  local_a8.x[2][1] = 3.88542912704029;
  local_a8.x[2][2] = 0.65367032943707;
  local_a8.x[2][3] = -0.2197110327041;
  local_a8.x[3][0] = -1.6536922346527;
  local_a8.x[3][1] = 0.92016316185369;
  local_a8.x[3][2] = -0.2197110327041;
  local_a8.x[3][3] = -0.28108876552761;
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(&local_a8);
  return;
}

Assistant:

void
testJacobiEigenSolverImp ()
{
    testJacobiEigenSolver (Matrix33<T> (A33_1));
    testJacobiEigenSolver (Matrix33<T> (A33_2));
    testJacobiEigenSolver (Matrix33<T> (A33_3));
    testJacobiEigenSolver (Matrix33<T> (A33_4));
    testJacobiEigenSolver (Matrix33<T> (A33_5));
    testJacobiEigenSolver (Matrix33<T> (A33_6));
    testJacobiEigenSolver (Matrix33<T> (A33_7));
    testJacobiEigenSolver (Matrix33<T> (A33_8));

    testJacobiEigenSolver (Matrix44<T> (A44_1));
    testJacobiEigenSolver (Matrix44<T> (A44_2));
    testJacobiEigenSolver (Matrix44<T> (A44_3));
    testJacobiEigenSolver (Matrix44<T> (A44_4));
    testJacobiEigenSolver (Matrix44<T> (A44_5));
    testJacobiEigenSolver (Matrix44<T> (A44_6));
    testJacobiEigenSolver (Matrix44<T> (A44_7));
    testJacobiEigenSolver (Matrix44<T> (A44_8));
}